

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequest.cpp
# Opt level: O1

void __thiscall QNetworkRequest::setOriginatingObject(QNetworkRequest *this,QObject *object)

{
  QNetworkRequestPrivate *pQVar1;
  Data *pDVar2;
  Data *pDVar3;
  
  pQVar1 = (this->d).d.ptr;
  if ((pQVar1 != (QNetworkRequestPrivate *)0x0) &&
     ((__atomic_base<int>)
      *(__int_type *)
       &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value != (__atomic_base<int>)0x1)) {
    QSharedDataPointer<QNetworkRequestPrivate>::detach_helper(&this->d);
  }
  pQVar1 = (this->d).d.ptr;
  if (object == (QObject *)0x0) {
    pDVar3 = (Data *)0x0;
  }
  else {
    pDVar3 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef(object);
  }
  pDVar2 = (pQVar1->super_QNetworkHeadersPrivate).originatingObject.wp.d;
  (pQVar1->super_QNetworkHeadersPrivate).originatingObject.wp.d = pDVar3;
  (pQVar1->super_QNetworkHeadersPrivate).originatingObject.wp.value = object;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->weakref)._q_value.super___atomic_base<int> =
         (__atomic_base<int>)((__int_type)(pDVar2->weakref)._q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if ((__int_type)(pDVar2->weakref)._q_value.super___atomic_base<int> == 0) {
      operator_delete(pDVar2);
      return;
    }
  }
  return;
}

Assistant:

void QNetworkRequest::setOriginatingObject(QObject *object)
{
    d->originatingObject = object;
}